

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic-base.hxx
# Opt level: O1

Solution * __thiscall
lineage::heuristics::
applyInitializedHeuristic<lineage::heuristics::LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>>,lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,std::allocator<double>>>>
          (Solution *__return_storage_ptr__,heuristics *this,ProblemGraph *problemGraph,
          double costTermination,double costBirth,bool enforceBifurcationConstraint,
          string *solutionName,size_t maxDistance)

{
  pointer puVar1;
  pointer *ppuVar2;
  long *plVar3;
  pointer __src;
  pointer puVar4;
  Solution *__return_storage_ptr___00;
  long lVar5;
  undefined7 in_register_00000009;
  long *plVar6;
  long *plVar7;
  ptrdiff_t _Num;
  ulong __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  Solution *solution;
  Data data;
  LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,_lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>_>
  search;
  double local_308;
  double local_300;
  Solution local_2f8;
  Solution local_2d8;
  Solution *local_2c0;
  undefined1 local_2b8 [24];
  string *local_2a0;
  pointer local_298;
  iterator iStack_290;
  double *local_288;
  bool local_280;
  _Alloc_hider local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  double local_258;
  time_point tStack_250;
  undefined8 local_248;
  _func_int **local_240;
  undefined1 local_238 [8];
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> DStack_230;
  pointer local_188;
  pointer local_178;
  vector<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
  local_168;
  ios_base local_140 [272];
  
  plVar6 = (long *)CONCAT71(in_register_00000009,enforceBifurcationConstraint);
  local_308 = costBirth;
  local_300 = costTermination;
  local_2c0 = __return_storage_ptr__;
  local_2b8._0_8_ = (ProblemGraph *)(local_2b8 + 0x10);
  std::__cxx11::string::_M_construct<char*>((string *)local_2b8,*plVar6,plVar6[1] + *plVar6);
  std::__cxx11::string::append((char *)local_2b8);
  std::ofstream::ofstream(local_238,(string *)local_2b8,_S_out);
  if ((ProblemGraph *)local_2b8._0_8_ != (ProblemGraph *)(local_2b8 + 0x10)) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_238,
             "time objBound objBest gap nSpaceCycle nSpaceTime nMorality nTermination nBirth nBifurcation objValue time_separation\n"
             ,0x75);
  std::ofstream::close();
  local_238 = (undefined1  [8])_VTT;
  local_240 = _VTT;
  local_248 = _typeinfo;
  *(undefined8 *)(local_238 + (long)_VTT[-3]) = _typeinfo;
  std::filebuf::~filebuf((filebuf *)(local_238 + 8));
  std::ios_base::~ios_base(local_140);
  local_298 = (pointer)0x0;
  iStack_290._M_current = (double *)0x0;
  local_288 = (double *)0x0;
  local_278._M_p = (pointer)&local_268;
  local_270 = 0;
  local_268._M_local_buf[0] = '\0';
  local_258 = 0.0;
  tStack_250.__d.__r = (duration)0;
  local_2b8._16_8_ = local_308;
  local_2b8._8_8_ = local_300;
  local_2b8._0_8_ = this;
  local_280 = (bool)(char)problemGraph;
  std::__cxx11::string::_M_assign((string *)&local_278);
  plVar7 = *(long **)(*(long *)this + 0x18);
  plVar3 = *(long **)(*(long *)this + 0x20);
  local_2a0 = solutionName;
  if (plVar7 != plVar3) {
    do {
      DStack_230.vertices_.
      super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar7[2];
      local_238 = (undefined1  [8])*plVar7;
      DStack_230.data_ = (Data *)plVar7[1];
      if (iStack_290._M_current == local_288) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_298,iStack_290,
                   (double *)&DStack_230.vertices_);
      }
      else {
        *iStack_290._M_current =
             (double)DStack_230.vertices_.
                     super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        iStack_290._M_current = iStack_290._M_current + 1;
      }
      plVar7 = plVar7 + 3;
    } while (plVar7 != plVar3);
  }
  if (0.0 < local_300) {
    std::vector<double,_std::allocator<double>_>::_M_fill_insert
              ((vector<double,_std::allocator<double>_> *)&local_298,iStack_290,
               *(long *)(this + 0x10) - *(long *)(this + 8) >> 5,&local_300);
  }
  if (0.0 < local_308) {
    std::vector<double,_std::allocator<double>_>::_M_fill_insert
              ((vector<double,_std::allocator<double>_> *)&local_298,iStack_290,
               *(long *)(this + 0x10) - *(long *)(this + 8) >> 5,&local_308);
  }
  tStack_250.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::
  GreedyLineageAgglomeration
            ((GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *)local_238,
             (Data *)local_2b8);
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::optimize
            ((GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *)local_238)
  ;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_>::getSolution
            (&local_2f8,
             (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *)(local_238 + 8));
  puVar4 = local_2f8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  __src = local_2f8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start;
  lVar5 = std::chrono::_V2::system_clock::now();
  local_258 = (double)(lVar5 - (long)tStack_250.__d.__r) / 1000000000.0 + local_258;
  local_238 = (undefined1  [8])&PTR_applyBestOperationAndUpdate_0014c748;
  std::
  vector<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
  ::~vector(&local_168);
  if (local_188 != (pointer)0x0) {
    operator_delete(local_188,(long)local_178 - (long)local_188);
  }
  DynamicLineage<std::vector<double,_std::allocator<double>_>_>::~DynamicLineage
            ((DynamicLineage<std::vector<double,_std::allocator<double>_>_> *)(local_238 + 8));
  ppuVar2 = &local_2f8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2f8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppuVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2f8,*plVar6,plVar6[1] + *plVar6);
  std::__cxx11::string::append((char *)&local_2f8);
  std::ofstream::ofstream(local_238,(string *)&local_2f8,_S_out);
  if ((pointer *)
      local_2f8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != ppuVar2) {
    operator_delete(local_2f8.edge_labels.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(local_2f8.edge_labels.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_238,
             "time objBound objBest gap nSpaceCycle nSpaceTime nMorality nTermination nBirth nBifurcation objValue time_separation\n"
             ,0x75);
  std::ofstream::close();
  local_238 = (undefined1  [8])local_240;
  *(undefined8 *)(local_238 + (long)local_240[-3]) = local_248;
  std::filebuf::~filebuf((filebuf *)(local_238 + 8));
  std::ios_base::~ios_base(local_140);
  tStack_250.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_2d8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = (long)local_2f8.edge_labels.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)__src;
  if (__n == 0) {
    local_2d8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    if ((long)__n < 0) {
      std::__throw_bad_alloc();
    }
    local_2d8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(__n);
  }
  puVar1 = local_2d8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start + __n;
  local_2d8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar1;
  if (local_2f8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != __src) {
    local_2d8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_2d8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    memmove(local_2d8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start,__src,__n);
  }
  local_2d8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  ::PartitionOptimizerBase
            ((PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
              *)local_238,(Data *)local_2b8,&local_2d8);
  __return_storage_ptr___00 = local_2c0;
  local_238 = (undefined1  [8])&PTR_optimize_0014c7a0;
  if (local_2d8.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8.edge_labels.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d8.edge_labels.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8.edge_labels.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  ::optimize((PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
              *)local_238);
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  ::getSolution(__return_storage_ptr___00,
                (PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
                 *)local_238);
  lVar5 = std::chrono::_V2::system_clock::now();
  local_258 = (double)(lVar5 - (long)tStack_250.__d.__r) / 1000000000.0 + local_258;
  postOptimizationChecks<lineage::Data,lineage::heuristics::LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>>,lineage::Solution>
            ((Data *)local_2b8,
             (LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,_lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>_>
              *)local_238,__return_storage_ptr___00);
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  ::~PartitionOptimizerBase
            ((PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
              *)local_238);
  if (__src != (pointer)0x0) {
    operator_delete(__src,(long)puVar4 - (long)__src);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_p != &local_268) {
    operator_delete(local_278._M_p,
                    CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0]) + 1);
  }
  if (local_298 != (pointer)0x0) {
    operator_delete(local_298,(long)local_288 - (long)local_298);
  }
  return __return_storage_ptr___00;
}

Assistant:

Solution
applyInitializedHeuristic(
    ProblemGraph const& problemGraph, double costTermination = .0,
    double costBirth = .0, bool enforceBifurcationConstraint = false,
    std::string solutionName = "heuristic",
    size_t maxDistance = std::numeric_limits<size_t>::max())
{

    // create log file/replace existing log file with empty log file
    {
        std::ofstream file(solutionName + "-optimization-log.txt");
        file << "time objBound objBest gap nSpaceCycle nSpaceTime nMorality "
                "nTermination nBirth nBifurcation objValue time_separation\n";
        file.close();
    }

    Data data(problemGraph);
    data.costBirth = costBirth;
    data.costTermination = costTermination;
    data.enforceBifurcationConstraint = enforceBifurcationConstraint;
    data.solutionName = solutionName;
    data.maxDistance = maxDistance;

    // define costs
    for (auto e : problemGraph.problem().edges)
        data.costs.push_back(e.weight);

    if (costTermination > 0.0)
        data.costs.insert(data.costs.end(),
                          problemGraph.graph().numberOfVertices(),
                          costTermination);

    if (costBirth > 0.0)
        data.costs.insert(data.costs.end(),
                          problemGraph.graph().numberOfVertices(), costBirth);

    Solution init;
    {
        data.timer.start();
        auto initializer = INITIALIZER(data);
        initializer.optimize();
        init = initializer.getSolution();
        data.timer.stop();
    }

    // create log replace log of initializer with empty log file
    {
        std::ofstream file(solutionName + "-optimization-log.txt");
        file << "time objBound objBest gap nSpaceCycle nSpaceTime nMorality "
                "nTermination nBirth nBifurcation objValue time_separation\n";
        file.close();
    }

    data.timer.start();
    auto search = OPTIMIZER(data, init);

    search.optimize();
    const auto solution = search.getSolution();
    data.timer.stop();

    postOptimizationChecks(data, search, solution);

    return solution;
}